

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

void __thiscall Scine::Core::ModuleManager::Impl::load(Impl *this,path *libraryPath)

{
  undefined1 uVar1;
  iterator __last;
  __normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  in_RDI;
  bool alreadyLoaded;
  LibraryAndModules lib;
  value_type *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  path *in_stack_ffffffffffffff98;
  LibraryAndModules *in_stack_ffffffffffffffa0;
  
  LibraryAndModules::LibraryAndModules(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __last = std::
           begin<std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>
                     ((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                       *)in_stack_ffffffffffffff78);
  std::
  end<std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>
            ((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
              *)in_stack_ffffffffffffff78);
  uVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Scine::Core::Module>*,std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>,Scine::Core::ModuleManager::Impl::load(boost::filesystem::path_const&)::_lambda(auto:1_const&)_1_>
                    (in_RDI,(__normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                             )__last._M_current,
                     (anon_class_8_1_8991fb9c_for__M_pred)in_RDI._M_current);
  if (!(bool)uVar1) {
    std::
    vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
    ::push_back((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                 *)CONCAT17(uVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
  }
  LibraryAndModules::~LibraryAndModules
            ((LibraryAndModules *)CONCAT17(uVar1,in_stack_ffffffffffffff80));
  return;
}

Assistant:

void load(const boost::filesystem::path& libraryPath) {
    LibraryAndModules lib{libraryPath};

    const bool alreadyLoaded = std::any_of(std::begin(lib.modules), std::end(lib.modules),
                                           [&](const auto& modulePtr) -> bool { return moduleLoaded(modulePtr->name()); });

    if (!alreadyLoaded) {
      _sources.push_back(std::move(lib));
    }
  }